

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_limit.cpp
# Opt level: O2

bool duckdb::PhysicalLimit::HandleOffset
               (DataChunk *input,idx_t *current_offset,idx_t offset,idx_t limit)

{
  idx_t iVar1;
  ulong uVar2;
  bool bVar3;
  idx_t iVar4;
  ulong uVar5;
  SelectionVector sel;
  SelectionVector local_48;
  
  iVar1 = input->count;
  uVar2 = *current_offset;
  if (uVar2 < offset) {
    if (uVar2 + iVar1 <= offset) {
      bVar3 = false;
      goto LAB_019cc2b5;
    }
    uVar5 = (uVar2 - offset) + iVar1;
    if (limit < uVar5) {
      uVar5 = limit;
    }
    SelectionVector::SelectionVector(&local_48,0x800);
    for (iVar4 = 0; uVar5 != iVar4; iVar4 = iVar4 + 1) {
      local_48.sel_vector[iVar4] = ((int)offset - (int)uVar2) + (int)iVar4;
    }
    DataChunk::Slice(input,input,&local_48,uVar5,0);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_48.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  else {
    uVar5 = offset + limit;
    if (limit == 0xffffffffffffffff) {
      uVar5 = 0xffffffffffffffff;
    }
    iVar4 = uVar5 - uVar2;
    if (uVar2 + iVar1 < uVar5) {
      iVar4 = iVar1;
    }
    DataChunk::Reference(input,input);
    input->count = iVar4;
  }
  bVar3 = true;
LAB_019cc2b5:
  *current_offset = *current_offset + iVar1;
  return bVar3;
}

Assistant:

bool PhysicalLimit::HandleOffset(DataChunk &input, idx_t &current_offset, idx_t offset, idx_t limit) {
	idx_t max_element = limit + offset;
	if (limit == DConstants::INVALID_INDEX) {
		max_element = DConstants::INVALID_INDEX;
	}
	idx_t input_size = input.size();
	if (current_offset < offset) {
		// we are not yet at the offset point
		if (current_offset + input.size() > offset) {
			// however we will reach it in this chunk
			// we have to copy part of the chunk with an offset
			idx_t start_position = offset - current_offset;
			auto chunk_count = MinValue<idx_t>(limit, input.size() - start_position);
			SelectionVector sel(STANDARD_VECTOR_SIZE);
			for (idx_t i = 0; i < chunk_count; i++) {
				sel.set_index(i, start_position + i);
			}
			// set up a slice of the input chunks
			input.Slice(input, sel, chunk_count);
		} else {
			current_offset += input_size;
			return false;
		}
	} else {
		// have to copy either the entire chunk or part of it
		idx_t chunk_count;
		if (current_offset + input.size() >= max_element) {
			// have to limit the count of the chunk
			chunk_count = max_element - current_offset;
		} else {
			// we copy the entire chunk
			chunk_count = input.size();
		}
		// instead of copying we just change the pointer in the current chunk
		input.Reference(input);
		input.SetCardinality(chunk_count);
	}

	current_offset += input_size;
	return true;
}